

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Return_Button.cxx
# Opt level: O2

int __thiscall Fl_Return_Button::handle(Fl_Return_Button *this,int event)

{
  int iVar1;
  
  if ((event == 0xc) && ((Fl::e_keysym | 0x80U) == 0xff8d)) {
    Fl_Button::simulate_key_action(&this->super_Fl_Button);
    Fl_Widget::do_callback((Fl_Widget *)this);
    return 1;
  }
  iVar1 = Fl_Button::handle(&this->super_Fl_Button,event);
  return iVar1;
}

Assistant:

int Fl_Return_Button::handle(int event) {
  if (event == FL_SHORTCUT &&
      (Fl::event_key() == FL_Enter || Fl::event_key() == FL_KP_Enter)) {
    simulate_key_action();
    do_callback();
    return 1;
  } else
    return Fl_Button::handle(event);
}